

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void DrawTextureNPatch(Texture2D texture,NPatchInfo nPatchInfo,Rectangle dest,Vector2 origin,
                      float rotation,Color tint)

{
  undefined1 auVar1 [16];
  NPatchInfo NVar2;
  undefined4 in_EDX;
  uint uVar3;
  float x;
  float y;
  float y_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float x_00;
  float x_01;
  float y_01;
  float fVar10;
  undefined1 auVar11 [16];
  float x_02;
  float y_02;
  float x_03;
  float fVar12;
  float x_04;
  float fVar13;
  float fVar14;
  float local_e8;
  float local_68;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  NVar2 = nPatchInfo;
  if (texture.id == 0) {
    return;
  }
  x_00 = (float)(-(uint)(0.0 < dest.width) & (uint)dest.width);
  y_01 = (float)(-(uint)(0.0 < dest.height) & (uint)dest.height);
  if (nPatchInfo.source.width < 0.0) {
    nPatchInfo.source.x = nPatchInfo.source.x - nPatchInfo.source.width;
  }
  auVar4._0_4_ = -(uint)(nPatchInfo.layout == 1);
  auVar4._4_4_ = -(uint)(nPatchInfo.layout == 2);
  auVar4._8_4_ = 0xffffffff;
  auVar4._12_4_ = 0xffffffff;
  auVar1._4_4_ = y_01;
  auVar1._0_4_ = x_00;
  auVar1._8_4_ = -(uint)(0.0 < dest.width) & (uint)dest.width;
  auVar1._12_4_ = -(uint)(0.0 < dest.height) & (uint)dest.height;
  auVar11._0_4_ = (uint)nPatchInfo.source.width & auVar4._0_4_;
  auVar11._4_4_ = (uint)nPatchInfo.source.height & auVar4._4_4_;
  auVar11._8_8_ = 0;
  auVar11 = auVar11 | ~auVar4 & auVar1;
  x_02 = (float)NVar2.left;
  y_02 = (float)NVar2.top;
  fVar13 = (float)NVar2.right;
  local_68 = (float)NVar2.bottom;
  fVar10 = auVar11._0_4_;
  fVar8 = auVar11._4_4_;
  auVar9._4_4_ = -(uint)(y_02 + local_68 < fVar8);
  auVar9._0_4_ = -(uint)(x_02 + fVar13 < fVar10);
  auVar9._8_4_ = -(uint)(0.0 < auVar11._8_4_);
  auVar9._12_4_ = -(uint)(0.0 < auVar11._12_4_);
  auVar9 = auVar9 | auVar4;
  auVar5._0_8_ = auVar9._0_8_;
  auVar5._8_4_ = auVar9._4_4_;
  auVar5._12_4_ = auVar9._12_4_;
  auVar6._0_8_ = auVar5._0_8_ << 0x3f;
  auVar6._8_8_ = auVar5._8_8_ << 0x3f;
  uVar3 = movmskpd(in_EDX,auVar6);
  x_04 = x_02;
  if ((uVar3 & 1) == 0) {
    x_04 = (x_02 / (x_02 + fVar13)) * fVar10;
    fVar13 = fVar10 - x_04;
  }
  fVar7 = (float)texture.width;
  fVar14 = (float)texture.height;
  fVar12 = (float)(~-(uint)(nPatchInfo.source.height < 0.0) & (uint)nPatchInfo.source.y |
                  (uint)(nPatchInfo.source.y - nPatchInfo.source.height) &
                  -(uint)(nPatchInfo.source.height < 0.0));
  local_e8 = y_02;
  if ((byte)((byte)uVar3 >> 1) == 0) {
    local_e8 = (y_02 / (y_02 + local_68)) * fVar8;
    local_68 = fVar8 - local_e8;
  }
  fVar10 = fVar10 - fVar13;
  x = nPatchInfo.source.x / fVar7;
  y = fVar12 / fVar14;
  x_03 = (nPatchInfo.source.x + x_04) / fVar7;
  x_01 = ((nPatchInfo.source.width + nPatchInfo.source.x) - fVar13) / fVar7;
  fVar7 = (nPatchInfo.source.width + nPatchInfo.source.x) / fVar7;
  fVar13 = (nPatchInfo.source.height + fVar12) / fVar14;
  rlSetTexture(texture.id);
  rlPushMatrix();
  local_58 = dest.x;
  fStack_54 = dest.y;
  rlTranslatef(local_58,fStack_54,0.0);
  rlRotatef(rotation,0.0,0.0,1.0);
  local_48 = origin.x;
  fStack_44 = origin.y;
  rlTranslatef(-local_48,-fStack_44,0.0);
  rlBegin(7);
  rlColor4ub(tint.r,tint.g,tint.b,tint.a);
  rlNormal3f(0.0,0.0,1.0);
  if (nPatchInfo.layout == 2) {
    rlTexCoord2f(x,fVar13);
    rlVertex2f(0.0,nPatchInfo.source.height);
    rlTexCoord2f(x_03,fVar13);
    rlVertex2f(x_04,nPatchInfo.source.height);
    rlTexCoord2f(x_03,y);
    rlVertex2f(x_04,0.0);
    rlTexCoord2f(x,y);
    rlVertex2f(0.0,0.0);
    if ((uVar3 & 1) != 0) {
      rlTexCoord2f(x_03,fVar13);
      rlVertex2f(x_02,nPatchInfo.source.height);
      rlTexCoord2f(x_01,fVar13);
      rlVertex2f(fVar10,nPatchInfo.source.height);
      rlTexCoord2f(x_01,y);
      rlVertex2f(fVar10,0.0);
      rlTexCoord2f(x_03,y);
      rlVertex2f(x_02,0.0);
    }
    rlTexCoord2f(x_01,fVar13);
    rlVertex2f(fVar10,nPatchInfo.source.height);
    rlTexCoord2f(fVar7,fVar13);
    rlVertex2f(x_00,nPatchInfo.source.height);
    rlTexCoord2f(fVar7,y);
    rlVertex2f(x_00,0.0);
    rlTexCoord2f(x_01,y);
    fVar8 = 0.0;
  }
  else {
    fVar8 = fVar8 - local_68;
    y_00 = (fVar12 + local_e8) / fVar14;
    fVar14 = ((nPatchInfo.source.height + fVar12) - local_68) / fVar14;
    if (nPatchInfo.layout == 1) {
      rlTexCoord2f(x,y_00);
      rlVertex2f(0.0,local_e8);
      rlTexCoord2f(fVar7,y_00);
      rlVertex2f(nPatchInfo.source.width,local_e8);
      rlTexCoord2f(fVar7,y);
      rlVertex2f(nPatchInfo.source.width,0.0);
      rlTexCoord2f(x,y);
      rlVertex2f(0.0,0.0);
      if ((uVar3 & 1) != 0) {
        rlTexCoord2f(x,fVar14);
        rlVertex2f(0.0,fVar8);
        rlTexCoord2f(fVar7,fVar14);
        rlVertex2f(nPatchInfo.source.width,fVar8);
        rlTexCoord2f(fVar7,y_00);
        rlVertex2f(nPatchInfo.source.width,local_e8);
        rlTexCoord2f(x,y_00);
        rlVertex2f(0.0,local_e8);
      }
      rlTexCoord2f(x,fVar13);
      rlVertex2f(0.0,y_01);
      rlTexCoord2f(fVar7,fVar13);
      rlVertex2f(nPatchInfo.source.width,y_01);
      rlTexCoord2f(fVar7,fVar14);
      rlVertex2f(nPatchInfo.source.width,fVar8);
      rlTexCoord2f(x,fVar14);
      fVar10 = 0.0;
    }
    else {
      if (nPatchInfo.layout != 0) goto LAB_0013b0d3;
      rlTexCoord2f(x,y_00);
      rlVertex2f(0.0,local_e8);
      rlTexCoord2f(x_03,y_00);
      rlVertex2f(x_04,local_e8);
      rlTexCoord2f(x_03,y);
      rlVertex2f(x_04,0.0);
      rlTexCoord2f(x,y);
      rlVertex2f(0.0,0.0);
      if ((uVar3 & 1) != 0) {
        rlTexCoord2f(x_03,y_00);
        rlVertex2f(x_02,local_e8);
        rlTexCoord2f(x_01,y_00);
        rlVertex2f(fVar10,local_e8);
        rlTexCoord2f(x_01,y);
        rlVertex2f(fVar10,0.0);
        rlTexCoord2f(x_03,y);
        rlVertex2f(x_02,0.0);
      }
      rlTexCoord2f(x_01,y_00);
      rlVertex2f(fVar10,local_e8);
      rlTexCoord2f(fVar7,y_00);
      rlVertex2f(x_00,local_e8);
      rlTexCoord2f(fVar7,y);
      rlVertex2f(x_00,0.0);
      rlTexCoord2f(x_01,y);
      rlVertex2f(fVar10,0.0);
      if ((byte)((byte)uVar3 >> 1) != 0) {
        rlTexCoord2f(x,fVar14);
        rlVertex2f(0.0,fVar8);
        rlTexCoord2f(x_03,fVar14);
        rlVertex2f(x_04,fVar8);
        rlTexCoord2f(x_03,y_00);
        rlVertex2f(x_04,y_02);
        rlTexCoord2f(x,y_00);
        rlVertex2f(0.0,y_02);
        if ((uVar3 & 1) != 0) {
          rlTexCoord2f(x_03,fVar14);
          rlVertex2f(x_02,fVar8);
          rlTexCoord2f(x_01,fVar14);
          rlVertex2f(fVar10,fVar8);
          rlTexCoord2f(x_01,y_00);
          rlVertex2f(fVar10,y_02);
          rlTexCoord2f(x_03,y_00);
          rlVertex2f(x_02,y_02);
        }
        rlTexCoord2f(x_01,fVar14);
        rlVertex2f(fVar10,fVar8);
        rlTexCoord2f(fVar7,fVar14);
        rlVertex2f(x_00,fVar8);
        rlTexCoord2f(fVar7,y_00);
        rlVertex2f(x_00,y_02);
        rlTexCoord2f(x_01,y_00);
        rlVertex2f(fVar10,y_02);
      }
      rlTexCoord2f(x,fVar13);
      rlVertex2f(0.0,y_01);
      rlTexCoord2f(x_03,fVar13);
      rlVertex2f(x_04,y_01);
      rlTexCoord2f(x_03,fVar14);
      rlVertex2f(x_04,fVar8);
      rlTexCoord2f(x,fVar14);
      rlVertex2f(0.0,fVar8);
      if ((uVar3 & 1) != 0) {
        rlTexCoord2f(x_03,fVar13);
        rlVertex2f(x_02,y_01);
        rlTexCoord2f(x_01,fVar13);
        rlVertex2f(fVar10,y_01);
        rlTexCoord2f(x_01,fVar14);
        rlVertex2f(fVar10,fVar8);
        rlTexCoord2f(x_03,fVar14);
        rlVertex2f(x_02,fVar8);
      }
      rlTexCoord2f(x_01,fVar13);
      rlVertex2f(fVar10,y_01);
      rlTexCoord2f(fVar7,fVar13);
      rlVertex2f(x_00,y_01);
      rlTexCoord2f(fVar7,fVar14);
      rlVertex2f(x_00,fVar8);
      rlTexCoord2f(x_01,fVar14);
    }
  }
  rlVertex2f(fVar10,fVar8);
LAB_0013b0d3:
  rlEnd();
  rlPopMatrix();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawTextureNPatch(Texture2D texture, NPatchInfo nPatchInfo, Rectangle dest, Vector2 origin, float rotation, Color tint)
{
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        float patchWidth = (dest.width <= 0.0f)? 0.0f : dest.width;
        float patchHeight = (dest.height <= 0.0f)? 0.0f : dest.height;

        if (nPatchInfo.source.width < 0) nPatchInfo.source.x -= nPatchInfo.source.width;
        if (nPatchInfo.source.height < 0) nPatchInfo.source.y -= nPatchInfo.source.height;
        if (nPatchInfo.layout == NPATCH_THREE_PATCH_HORIZONTAL) patchHeight = nPatchInfo.source.height;
        if (nPatchInfo.layout == NPATCH_THREE_PATCH_VERTICAL) patchWidth = nPatchInfo.source.width;

        bool drawCenter = true;
        bool drawMiddle = true;
        float leftBorder = (float)nPatchInfo.left;
        float topBorder = (float)nPatchInfo.top;
        float rightBorder = (float)nPatchInfo.right;
        float bottomBorder = (float)nPatchInfo.bottom;

        // adjust the lateral (left and right) border widths in case patchWidth < texture.width
        if (patchWidth <= (leftBorder + rightBorder) && nPatchInfo.layout != NPATCH_THREE_PATCH_VERTICAL)
        {
            drawCenter = false;
            leftBorder = (leftBorder/(leftBorder + rightBorder))*patchWidth;
            rightBorder = patchWidth - leftBorder;
        }
        // adjust the lateral (top and bottom) border heights in case patchHeight < texture.height
        if (patchHeight <= (topBorder + bottomBorder) && nPatchInfo.layout != NPATCH_THREE_PATCH_HORIZONTAL)
        {
            drawMiddle = false;
            topBorder = (topBorder/(topBorder + bottomBorder))*patchHeight;
            bottomBorder = patchHeight - topBorder;
        }

        Vector2 vertA, vertB, vertC, vertD;
        vertA.x = 0.0f;                             // outer left
        vertA.y = 0.0f;                             // outer top
        vertB.x = leftBorder;                       // inner left
        vertB.y = topBorder;                        // inner top
        vertC.x = patchWidth  - rightBorder;        // inner right
        vertC.y = patchHeight - bottomBorder;       // inner bottom
        vertD.x = patchWidth;                       // outer right
        vertD.y = patchHeight;                      // outer bottom

        Vector2 coordA, coordB, coordC, coordD;
        coordA.x = nPatchInfo.source.x/width;
        coordA.y = nPatchInfo.source.y/height;
        coordB.x = (nPatchInfo.source.x + leftBorder)/width;
        coordB.y = (nPatchInfo.source.y + topBorder)/height;
        coordC.x = (nPatchInfo.source.x + nPatchInfo.source.width  - rightBorder)/width;
        coordC.y = (nPatchInfo.source.y + nPatchInfo.source.height - bottomBorder)/height;
        coordD.x = (nPatchInfo.source.x + nPatchInfo.source.width)/width;
        coordD.y = (nPatchInfo.source.y + nPatchInfo.source.height)/height;

        rlSetTexture(texture.id);

        rlPushMatrix();
            rlTranslatef(dest.x, dest.y, 0.0f);
            rlRotatef(rotation, 0.0f, 0.0f, 1.0f);
            rlTranslatef(-origin.x, -origin.y, 0.0f);

            rlBegin(RL_QUADS);
                rlColor4ub(tint.r, tint.g, tint.b, tint.a);
                rlNormal3f(0.0f, 0.0f, 1.0f);               // Normal vector pointing towards viewer

                if (nPatchInfo.layout == NPATCH_NINE_PATCH)
                {
                    // ------------------------------------------------------------
                    // TOP-LEFT QUAD
                    rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordA.y); rlVertex2f(vertA.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // TOP-CENTER QUAD
                        rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-left corner for texture and quad
                    }
                    // TOP-RIGHT QUAD
                    rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordA.y); rlVertex2f(vertD.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawMiddle)
                    {
                        // ------------------------------------------------------------
                        // MIDDLE-LEFT QUAD
                        rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Top-left corner for texture and quad
                        if (drawCenter)
                        {
                            // MIDDLE-CENTER QUAD
                            rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Bottom-left corner for texture and quad
                            rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Bottom-right corner for texture and quad
                            rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Top-right corner for texture and quad
                            rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Top-left corner for texture and quad
                        }

                        // MIDDLE-RIGHT QUAD
                        rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Top-left corner for texture and quad
                    }

                    // ------------------------------------------------------------
                    // BOTTOM-LEFT QUAD
                    rlTexCoord2f(coordA.x, coordD.y); rlVertex2f(vertA.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // BOTTOM-CENTER QUAD
                        rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Top-left corner for texture and quad
                    }

                    // BOTTOM-RIGHT QUAD
                    rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordD.y); rlVertex2f(vertD.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Top-left corner for texture and quad
                }
                else if (nPatchInfo.layout == NPATCH_THREE_PATCH_VERTICAL)
                {
                    // TOP QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordA.y); rlVertex2f(vertD.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordA.y); rlVertex2f(vertA.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // MIDDLE QUAD
                        // -----------------------------------------------------------
                        // Texture coords                 Vertices
                        rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Top-left corner for texture and quad
                    }
                    // BOTTOM QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordA.x, coordD.y); rlVertex2f(vertA.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordD.y); rlVertex2f(vertD.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Top-left corner for texture and quad
                }
                else if (nPatchInfo.layout == NPATCH_THREE_PATCH_HORIZONTAL)
                {
                    // LEFT QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordA.x, coordD.y); rlVertex2f(vertA.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordA.y); rlVertex2f(vertA.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // CENTER QUAD
                        // -----------------------------------------------------------
                        // Texture coords                 Vertices
                        rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-left corner for texture and quad
                    }
                    // RIGHT QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordD.y); rlVertex2f(vertD.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordA.y); rlVertex2f(vertD.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-left corner for texture and quad
                }
            rlEnd();
        rlPopMatrix();

        rlSetTexture(0);
    }
}